

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mau.cpp
# Opt level: O2

MauResult mau_proxy_create(MauProxyConfig *config,MauChannelConfig *channel,char *hostname,
                          uint16_t port,MauProxy *proxyOut)

{
  MauResult MVar1;
  OutputWorker *this;
  ProxySession *this_00;
  Locker locker;
  
  locker.TheLock = &LoggerLock;
  std::recursive_mutex::lock(&LoggerLock.cs);
  if (LoggerRefs == 0) {
    this = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Start(this);
  }
  LoggerRefs = LoggerRefs + 1;
  mau::Locker::~Locker(&locker);
  MVar1 = Mau_InvalidInput;
  if (proxyOut == (MauProxy *)0x0 || config == (MauProxyConfig *)0x0) {
    if (proxyOut == (MauProxy *)0x0) goto LAB_00105e8e;
  }
  else if ((((config->Version == 3) &&
            ((((config->SendHook != (MauSendHookFunction)0x0 ||
               (((0xffff0000 < config->UDPListenPort - 0x10000 &&
                 (2000 < config->UDPRecvBufferSizeBytes)) && (2000 < config->UDPSendBufferSizeBytes)
                ))) && (((config->MaxDatagramBytes != 0 && (0.0 <= channel->LossRate)) &&
                        (channel->LossRate <= 1.0)))) &&
             ((0.0 <= channel->DeliveryRate && (channel->DeliveryRate <= 1.0)))))) &&
           ((0.01 < channel->Router_MBPS &&
            ((((10 < channel->Router_QueueMsec &&
               (channel->ReorderMinimumLatencyMsec <= channel->ReorderMaximumLatencyMsec)) &&
              (0.0 <= channel->ReorderRate)) &&
             ((channel->ReorderRate <= 1.0 && (0.0 <= channel->OrderRate)))))))) &&
          ((channel->OrderRate <= 1.0 &&
           (((0.0 <= channel->DuplicateRate && (channel->DuplicateRate <= 1.0)) &&
            ((0.0 <= channel->CorruptionRate && (channel->CorruptionRate <= 1.0)))))))) {
    this_00 = (ProxySession *)operator_new(0x5d0,(nothrow_t *)&std::nothrow);
    if (this_00 == (ProxySession *)0x0) {
      MVar1 = Mau_OOM;
    }
    else {
      mau::ProxySession::ProxySession(this_00);
      MVar1 = mau::ProxySession::Initialize(this_00,hostname,port,config,channel);
      if (MVar1 == Mau_Success) {
        *proxyOut = (MauProxy)this_00;
        return Mau_Success;
      }
      mau::ProxySession::~ProxySession(this_00);
      operator_delete(this_00);
    }
  }
  *proxyOut = (MauProxy)0x0;
LAB_00105e8e:
  DecrementLoggerRefs();
  return MVar1;
}

Assistant:

MAU_EXPORT MauResult mau_proxy_create(
    const MauProxyConfig*    config, ///< [in] Configuration for the socket
    const MauChannelConfig* channel, ///< [in] Channel configuration
    const char*            hostname, ///< [in] Hostname of the server
    uint16_t                   port, ///< [in] UDP Port for the server
    MauProxy*              proxyOut  ///< [out] Created socket, or 0 on failure
)
{
    IncrementLoggerRefs();

    ProxySession* session = nullptr;
    MauResult result = Mau_Error;

    if (!config || !proxyOut)
    {
        MAU_DEBUG_BREAK(); // Invalid input
        result = Mau_InvalidInput;
        goto OnError;
    }

    if (config->Version != MAU_VERSION)
    {
        MAU_DEBUG_BREAK(); // Invalid input
        result = Mau_InvalidInput;
        goto OnError;
    }

    if (!ValidateMauProxyConfig(*config))
    {
        MAU_DEBUG_BREAK(); // Invalid input
        result = Mau_InvalidInput;
        goto OnError;
    }

    if (!ValidateMauChannelConfig(*channel))
    {
        MAU_DEBUG_BREAK(); // Invalid input
        result = Mau_InvalidInput;
        goto OnError;
    }

    session = new (std::nothrow) ProxySession;
    if (!session)
    {
        MAU_DEBUG_BREAK(); // Out of memory
        result = Mau_OOM;
        goto OnError;
    }

    result = session->Initialize(hostname, port, *config, *channel);
    if (MAU_FAILED(result))
    {
        delete session;
        session = nullptr;
        goto OnError;
    }

OnError:
    if (proxyOut)
        *proxyOut = reinterpret_cast<MauProxy>(session);

    if (!session)
        DecrementLoggerRefs();

    return result;
}